

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_Parameters_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Int64Parameter>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::Int64Parameter> *)
             _Int64Parameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::DoubleParameter>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::DoubleParameter> *)
           _DoubleParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::StringParameter>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::StringParameter> *)
           _StringParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::BoolParameter>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::BoolParameter> *)
             _BoolParameter_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Int64Parameter_default_instance_.Shutdown();
  _DoubleParameter_default_instance_.Shutdown();
  _StringParameter_default_instance_.Shutdown();
  _BoolParameter_default_instance_.Shutdown();
}